

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O3

void __thiscall Assimp::Collada::Animation::~Animation(Animation *this)

{
  Animation *this_00;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppAVar3;
  
  ppAVar3 = (this->mSubAnims).
            super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppAVar3 !=
      (this->mSubAnims).
      super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppAVar3;
      if (this_00 != (Animation *)0x0) {
        ~Animation(this_00);
      }
      operator_delete(this_00,0x50);
      ppAVar3 = ppAVar3 + 1;
    } while (ppAVar3 !=
             (this->mSubAnims).
             super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    ppAVar3 = (this->mSubAnims).
              super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppAVar3 != (pointer)0x0) {
    operator_delete(ppAVar3,(long)(this->mSubAnims).
                                  super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppAVar3
                   );
  }
  std::vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
  ::~vector(&this->mChannels);
  pcVar1 = (this->mName)._M_dataplus._M_p;
  paVar2 = &(this->mName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Animation()
    {
        for( std::vector<Animation*>::iterator it = mSubAnims.begin(); it != mSubAnims.end(); ++it)
            delete *it;
    }